

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O2

ON_3dVector * __thiscall
ON_Ellipse::DerivativeAt(ON_3dVector *__return_storage_ptr__,ON_Ellipse *this,int d,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  uint uVar5;
  double local_68;
  ON_3dVector local_50;
  ON_3dVector local_38;
  
  dVar1 = this->radius[0];
  dVar2 = this->radius[1];
  uVar5 = -d;
  if (0 < d) {
    uVar5 = d;
  }
  switch(uVar5 & 3) {
  case 0:
    local_68 = cos(t);
    dVar3 = sin(t);
    uVar4 = SUB84(dVar3,0);
    uVar5 = (uint)((ulong)dVar3 >> 0x20);
    goto LAB_0047b84d;
  case 1:
    local_68 = sin(t);
    local_68 = -local_68;
    dVar3 = cos(t);
    uVar4 = SUB84(dVar3,0);
    uVar5 = (uint)((ulong)dVar3 >> 0x20);
    goto LAB_0047b84d;
  case 2:
    local_68 = cos(t);
    local_68 = -local_68;
    dVar3 = sin(t);
    uVar4 = SUB84(dVar3,0);
    uVar5 = (uint)((ulong)dVar3 >> 0x20);
    break;
  case 3:
    local_68 = sin(t);
    dVar3 = cos(t);
    uVar4 = SUB84(dVar3,0);
    uVar5 = (uint)((ulong)dVar3 >> 0x20);
  }
  uVar5 = uVar5 ^ 0x80000000;
LAB_0047b84d:
  ::operator*(&local_38,dVar1 * local_68,&(this->plane).xaxis);
  ::operator*(&local_50,dVar2 * (double)CONCAT44(uVar5,uVar4),&(this->plane).yaxis);
  ON_3dVector::operator+(__return_storage_ptr__,&local_38,&local_50);
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Ellipse::DerivativeAt( 
                 int d, // desired derivative ( >= 0 )
                 double t // parameter
                 ) const
{
  double r0 = radius[0];
  double r1 = radius[1];
  switch ( std::abs(d) % 4 )
  {
  case 0:
    r0 *=  cos(t);
    r1 *=  sin(t);
    break;
  case 1:
    r0 *= -sin(t);
    r1 *=  cos(t);
    break;
  case 2:
    r0 *= -cos(t);
    r1 *= -sin(t);
    break;
  case 3:
    r0 *=  sin(t);
    r1 *= -cos(t);
    break;
  }
  return ( r0*plane.xaxis + r1*plane.yaxis );
}